

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall sjtu::index_out_of_bound::~index_out_of_bound(index_out_of_bound *this)

{
  exception *in_RDI;
  
  in_RDI->_vptr_exception = (_func_int **)&PTR_what_abi_cxx11__001378f8;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  exception::~exception(in_RDI);
  return;
}

Assistant:

index_out_of_bound() {
	    wro = "index_out_of_bound";
	}